

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDALine.h
# Opt level: O1

void __thiscall
TRM::line_bresenham_interpolator::line_bresenham_interpolator
          (line_bresenham_interpolator *this,int x1,int y1,int x2,int y2)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  this->m_x1_lr = x1 >> 8;
  this->m_y1_lr = y1 >> 8;
  this->m_x2_lr = x2 >> 8;
  uVar6 = (x2 >> 8) - (x1 >> 8);
  uVar4 = -uVar6;
  if (0 < (int)uVar6) {
    uVar4 = uVar6;
  }
  this->m_y2_lr = y2 >> 8;
  uVar7 = (y2 >> 8) - (y1 >> 8);
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  bVar8 = uVar4 < uVar6;
  this->m_ver = bVar8;
  if (uVar6 < uVar4) {
    uVar6 = uVar4;
  }
  this->m_len = uVar6;
  bVar2 = x1 < x2;
  if (bVar8) {
    bVar2 = y1 < y2;
  }
  this->m_inc = (uint)bVar2 * 2 + -1;
  if (bVar8) {
    y2 = x2;
    y1 = x1;
  }
  uVar4 = 1;
  if (1 < (int)uVar6) {
    uVar4 = uVar6;
  }
  (this->m_interpolator).m_cnt = uVar4;
  iVar3 = (y2 - y1) / (int)uVar4;
  iVar5 = (y2 - y1) % (int)uVar4;
  (this->m_interpolator).m_lft = iVar3;
  (this->m_interpolator).m_rem = iVar5;
  (this->m_interpolator).m_mod = iVar5;
  (this->m_interpolator).m_y = y1;
  if (iVar5 < 1) {
    (this->m_interpolator).m_mod = iVar5 + uVar6;
    (this->m_interpolator).m_rem = iVar5 + uVar6;
    (this->m_interpolator).m_lft = iVar3 + -1;
  }
  piVar1 = &(this->m_interpolator).m_mod;
  *piVar1 = *piVar1 - uVar6;
  return;
}

Assistant:

explicit line_bresenham_interpolator(int x1, int y1, int x2, int y2)
      : m_x1_lr(line_lr(x1)),
        m_y1_lr(line_lr(y1)),
        m_x2_lr(line_lr(x2)),
        m_y2_lr(line_lr(y2)),
        m_ver(std::abs(m_x2_lr - m_x1_lr) < std::abs(m_y2_lr - m_y1_lr)),
        m_len(m_ver ? std::abs(m_y2_lr - m_y1_lr)
                    : std::abs(m_x2_lr - m_x1_lr)),
        m_inc(m_ver ? ((y2 > y1) ? 1 : -1) : ((x2 > x1) ? 1 : -1)),
        m_interpolator(m_ver ? x1 : y1, m_ver ? x2 : y2, m_len) {}